

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_controller.h
# Opt level: O2

bool __thiscall n_e_s::core::NesController::get(NesController *this,Button button)

{
  switch(button) {
  case A:
    return this->a_;
  case B:
    return this->b_;
  case Select:
    return this->select_;
  case Start:
    return this->start_;
  case Up:
    return this->up_;
  case Down:
    return this->down_;
  case Left:
    return this->left_;
  case Right:
    return this->right_;
  default:
    return false;
  }
}

Assistant:

bool get(Button button) override {
        switch (button) {
        case Button::A:
            return a_;
        case Button::B:
            return b_;
        case Button::Select:
            return select_;
        case Button::Start:
            return start_;
        case Button::Up:
            return up_;
        case Button::Down:
            return down_;
        case Button::Left:
            return left_;
        case Button::Right:
            return right_;
        default:
            return false;
        }
    }